

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_test.cpp
# Opt level: O0

void __thiscall pools::~pools(pools *this)

{
  std::weak_ptr<cppcms::application_specific_pool>::~weak_ptr
            ((weak_ptr<cppcms::application_specific_pool> *)0x11a8cc);
  std::weak_ptr<cppcms::application_specific_pool>::~weak_ptr
            ((weak_ptr<cppcms::application_specific_pool> *)0x11a8d6);
  return;
}

Assistant:

pools() : async_requested(false) {}